

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

word * If_DsdManGetFuncConfig(If_DsdMan_t *p,int iDsd)

{
  int iVar1;
  Vec_Wrd_t *p_00;
  int iVar2;
  word *pwVar3;
  
  p_00 = p->vConfigs;
  if (p_00 != (Vec_Wrd_t *)0x0) {
    iVar1 = p->nConfigWords;
    iVar2 = Abc_Lit2Var(iDsd);
    pwVar3 = Vec_WrdEntryP(p_00,iVar1 * iVar2);
    return pwVar3;
  }
  return (word *)0x0;
}

Assistant:

word * If_DsdManGetFuncConfig( If_DsdMan_t * p, int iDsd )
{
    return p->vConfigs ? Vec_WrdEntryP(p->vConfigs, p->nConfigWords * Abc_Lit2Var(iDsd)) : NULL;
}